

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

void __thiscall HV_Edit_Buffer::add(HV_Edit_Buffer *this,char c)

{
  int iVar1;
  
  check(this,1);
  iVar1 = this->size_;
  this->size_ = iVar1 + 1;
  this->buf_[iVar1] = c;
  this->buf_[this->size_] = '\0';
  return;
}

Assistant:

void HV_Edit_Buffer::add(char c) {

  check(1);

#if (DEBUG_EDIT_BUFFER > 1)
  printf("HV_Edit_Buffer::add(char = '%c'), allocated=%d, size=%d\n",
	 c, allocated_, size_+1);
  fflush(stdout);
#endif

  buf_[size_++] = c;
  buf_[size_] = '\0';

}